

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu.c
# Opt level: O1

void mmu_write(gb_mmu_t *mmu,uint16_t addr,uint8_t byte)

{
  undefined7 in_register_00000011;
  undefined6 in_register_00000032;
  
  if (mmu != (gb_mmu_t *)0x0) {
    (*(code *)(&DAT_00109900 + *(int *)(&DAT_00109900 + (ulong)(addr >> 0xc) * 4)))
              (mmu->gb,addr,CONCAT71(in_register_00000011,byte),
               CONCAT62(in_register_00000032,addr) & 0xffffffff,
               &DAT_00109900 + *(int *)(&DAT_00109900 + (ulong)(addr >> 0xc) * 4));
    return;
  }
  __assert_fail("mmu != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/mmu.c"
                ,0x101,"void mmu_write(gb_mmu_t *, uint16_t, uint8_t)");
}

Assistant:

void mmu_write(gb_mmu_t *mmu, uint16_t addr, uint8_t byte)
{
    assert(mmu != NULL);

    gb_t *gb = mmu->gb;

    switch (addr & 0xF000)
    {
    case 0x0000:
    case 0x1000:
    case 0x2000:
    case 0x3000:
    case 0x4000:
    case 0x5000:
    case 0x6000:
    case 0x7000:
    case 0xA000:
    case 0xB000:
        // ROM and external RAM requests are redirected to the cartridge
        if ((!mmu->bootrom_mapped || addr >= 0x100) && mmu->cart != NULL)
            cart_write(mmu->cart, addr, byte);
        break;

    case 0x8000:
    case 0x9000:
        ppu_vram_write(&gb->ppu, addr, byte);
        break;

    case 0xC000:
    case 0xD000:
        // Internal RAM
        mmu->ram[addr - 0xC000] = byte;
        break;
    
    case 0xE000:
        // unused
        break;

    case 0xF000:
        switch (addr & 0xF00)
        {
        case 0x000:
        case 0x100:
        case 0x200:
        case 0x300:
        case 0x400:
        case 0x500:
        case 0x600:
        case 0x700:
        case 0x800:
        case 0x900:
        case 0xA00:
        case 0xB00:
        case 0xC00:
        case 0xD00:
            // unused
            break;
        
        case 0xE00:
            if (addr >= 0xFEA0)
                // unused
                break;
            
            // OAM
            ppu_oam_write(&gb->ppu, addr, byte);
            break;

        case 0xF00:
            switch (addr & 0xFF)
            {
            case 0x0F:
                // IF (interrupt controller)
                int_if_write(&gb->intr_ctrl, byte);
                break;

            case 0xFF:
                // IE (interrupt controller)
                int_ie_write(&gb->intr_ctrl, byte);
                break;

            case 0x00:
                // JOYP (Joypad)
                joypad_joyp_write(&gb->joypad, byte);
                break;

            case 0x04:
                // DIV (timer)
                timer_div_write(&gb->timer, byte);
                break;

            case 0x05:
                // TIMA (timer)
                timer_tima_write(&gb->timer, byte);
                break;

            case 0x06:
                // TMA (timer)
                timer_tma_write(&gb->timer, byte);
                break;

            case 0x07:
                // TAC (timer)
                timer_tac_write(&gb->timer, byte);
                break;

            case 0x40:
                // LCDC (PPU)
                ppu_lcdc_write(&gb->ppu, byte);
                break;

            case 0x41:
                // STAT (PPU)
                ppu_stat_write(&gb->ppu, byte);
                break;

            case 0x42:
                // SCY (PPU)
                ppu_scy_write(&gb->ppu, byte);
                break;

            case 0x43:
                // SCX (PPU)
                ppu_scx_write(&gb->ppu, byte);
                break;

            case 0x44:
                // LY (PPU)
                ppu_ly_write(&gb->ppu, byte);
                break;

            case 0x45:
                // LYC (PPU)
                ppu_lyc_write(&gb->ppu, byte);
                break;

            case 0x46:
                // DMA (PPU)
                ppu_dma_write(&gb->ppu, byte);
                break;

            case 0x47:
                // BGP (PPU)
                ppu_bgp_write(&gb->ppu, byte);
                break;

            case 0x48:
                // OBP0 (PPU)
                ppu_obp0_write(&gb->ppu, byte);
                break;

            case 0x49:
                // OBP1 (PPU)
                ppu_obp1_write(&gb->ppu, byte);
                break;

            case 0x4A:
                // WY (PPU)
                ppu_wy_write(&gb->ppu, byte);
                break;

            case 0x4B:
                // WX (PPU)
                ppu_wx_write(&gb->ppu, byte);
                break;

            case 0x50:
                // Bootrom mapping
                mmu->bootrom_mapped = false;
                break;

            default:
                if (addr >= 0xFF80 && addr < 0xFFFF)
                    mmu->hram[addr - 0xFF80] = byte;
                
                break;
            }

            break;
        }

        break;
    }
}